

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_memprof.c
# Opt level: O1

void memprof_write_func(memprof *mp,uint8_t aevent)

{
  uint uVar1;
  TValue *pTVar2;
  lua_State *L;
  GCfunc *fn;
  lj_wbuf *out;
  cTValue *nextframe;
  GCfunc *fn_00;
  cTValue *pcVar3;
  
  out = &mp->out;
  L = (lua_State *)(ulong)(mp->g->mem_L).gcptr32;
  pTVar2 = L->base;
  fn = (GCfunc *)(ulong)pTVar2[-1].u32.lo;
  if ((fn->c).ffid != '\x01') {
    if ((fn->c).ffid == '\0') {
      memprof_write_lfunc(out,aevent,fn,L,(cTValue *)0x0);
      return;
    }
    uVar1 = *(uint *)((long)pTVar2 + -4);
    nextframe = pTVar2 + -1;
    if (((long)(int)uVar1 & 3U) == 0) {
      pcVar3 = nextframe + (-1 - (ulong)*(byte *)((ulong)uVar1 - 3));
    }
    else {
      pcVar3 = (cTValue *)((long)nextframe - ((long)(int)uVar1 & 0xfffffffffffffff8U));
    }
    fn_00 = (GCfunc *)(ulong)(pcVar3->u32).lo;
    if ((fn_00 != (GCfunc *)0x0) && ((fn_00->c).ffid == '\0')) {
      memprof_write_lfunc(out,aevent,fn_00,L,nextframe);
      return;
    }
  }
  memprof_write_cfunc(out,aevent,fn,L,&mp->lib_adds);
  return;
}

Assistant:

static void memprof_write_func(struct memprof *mp, uint8_t aevent)
{
  struct lj_wbuf *out = &mp->out;
  lua_State *L = gco2th(gcref(mp->g->mem_L));
  cTValue *frame = L->base - 1;
  GCfunc *fn = frame_func(frame);

  if (isluafunc(fn))
    memprof_write_lfunc(out, aevent, fn, L, NULL);
  else if (isffunc(fn))
    memprof_write_ffunc(out, aevent, fn, L, frame, &mp->lib_adds);
  else if (iscfunc(fn))
    memprof_write_cfunc(out, aevent, fn, L, &mp->lib_adds);
  else
    lj_assertL(0, "unknown function type to write by memprof");
}